

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

int __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
SpaceUsedExcludingSelf
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  Rep *pRVar1;
  size_t sVar2;
  LogMessage *other;
  ulong uVar3;
  long lVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar3 = (long)(this->super_RepeatedPtrFieldBase).total_size_ << 3;
  pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
  if (pRVar1 != (Rep *)0x0) {
    if (0 < pRVar1->allocated_size) {
      lVar4 = 0;
      do {
        sVar2 = internal::StringSpaceUsedExcludingSelfLong((string *)pRVar1->elements[lVar4]);
        uVar3 = uVar3 + sVar2 + 0x20;
        lVar4 = lVar4 + 1;
        pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
      } while (lVar4 < pRVar1->allocated_size);
    }
    uVar3 = uVar3 + 8;
  }
  if (uVar3 >> 0x1f != 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/message_lite.h",0x71);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (size) <= (static_cast<size_t>(2147483647)): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (int)uVar3;
}

Assistant:

inline size_t RepeatedPtrFieldBase::SpaceUsedExcludingSelfLong() const {
  size_t allocated_bytes = static_cast<size_t>(total_size_) * sizeof(void*);
  if (rep_ != NULL) {
    for (int i = 0; i < rep_->allocated_size; ++i) {
      allocated_bytes +=
          TypeHandler::SpaceUsedLong(*cast<TypeHandler>(rep_->elements[i]));
    }
    allocated_bytes += kRepHeaderSize;
  }
  return allocated_bytes;
}